

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::
     TupleMatches<std::tr1::tuple<testing::Matcher<unsigned_long_long>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<unsigned_long_long,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<unsigned_long_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matcher_tuple,
               tuple<unsigned_long_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>
               *value_tuple)

{
  bool bVar1;
  tuple<unsigned_long_long,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_RDI;
  tuple<testing::Matcher<unsigned_long_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  *unaff_retaddr;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tr1::tuple<testing::Matcher<unsigned_long_long>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<unsigned_long_long,void,void,void,void,void,void,void,void,void>>
                    (unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  using ::std::tr1::tuple_size;
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(tuple_size<MatcherTuple>::value ==
                        tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<tuple_size<ValueTuple>::value>::
      Matches(matcher_tuple, value_tuple);
}